

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EBFArrayBox.cpp
# Opt level: O2

FArrayBox * __thiscall amrex::EBFArrayBox::getVolFracData(EBFArrayBox *this)

{
  FabArray<amrex::FArrayBox> *this_00;
  FArrayBox *pFVar1;
  
  if ((this->m_factory != (EBFArrayBoxFactory *)0x0) && (-1 < this->m_box_index)) {
    this_00 = &EBFArrayBoxFactory::getVolFrac(this->m_factory)->super_FabArray<amrex::FArrayBox>;
    pFVar1 = FabArray<amrex::FArrayBox>::fabPtr(this_00,this->m_box_index);
    return pFVar1;
  }
  return (FArrayBox *)0x0;
}

Assistant:

const FArrayBox*
EBFArrayBox::getVolFracData () const
{
    if (m_factory && m_box_index >= 0) {
        MultiFab const& mf = m_factory->getVolFrac();
        return &(mf[m_box_index]);
    } else {
        return nullptr;
    }
}